

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

Pipeline * __thiscall CoreML::Specification::Model::mutable_pipeline(Model *this)

{
  bool bVar1;
  Pipeline *this_00;
  Model *this_local;
  
  bVar1 = has_pipeline(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_pipeline(this);
    this_00 = (Pipeline *)operator_new(0x48);
    Pipeline::Pipeline(this_00);
    (this->Type_).pipeline_ = this_00;
  }
  return (Pipeline *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::Pipeline* Model::mutable_pipeline() {
  if (!has_pipeline()) {
    clear_Type();
    set_has_pipeline();
    Type_.pipeline_ = new ::CoreML::Specification::Pipeline;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.pipeline)
  return Type_.pipeline_;
}